

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint readChunk_tEXt(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  long lVar1;
  uint uVar2;
  char *key;
  char *str;
  size_t size;
  uint uVar3;
  ulong __size;
  ulong uVar4;
  char *orig;
  
  uVar2 = 0x59;
  if (chunkLength == 0) {
LAB_001208c8:
    key = (char *)0x0;
  }
  else {
    uVar4 = 0;
    do {
      uVar3 = (uint)uVar4;
      if (data[uVar4] == '\0') break;
      uVar3 = uVar3 + 1;
      uVar4 = (ulong)uVar3;
    } while (uVar4 < chunkLength);
    if (uVar3 - 0x50 < 0xffffffb1) goto LAB_001208c8;
    __size = (ulong)(uVar3 + 1);
    key = (char *)malloc(__size);
    uVar2 = 0x53;
    if (key == (char *)0x0) goto LAB_001208c8;
    memcpy(key,data,uVar4);
    key[uVar4] = '\0';
    uVar4 = chunkLength - __size;
    if (chunkLength < __size) {
      uVar4 = 0;
    }
    str = (char *)malloc((ulong)((int)uVar4 + 1));
    if (str != (char *)0x0) {
      uVar4 = uVar4 & 0xffffffff;
      if (uVar4 != 0) {
        memcpy(str,data + __size,uVar4);
      }
      str[uVar4] = '\0';
      size = 0xffffffffffffffff;
      do {
        lVar1 = size + 1;
        size = size + 1;
      } while (str[lVar1] != '\0');
      uVar2 = lodepng_add_text_sized(info,key,str,size);
      goto LAB_001208ce;
    }
  }
  str = (char *)0x0;
LAB_001208ce:
  free(key);
  free(str);
  return uVar2;
}

Assistant:

static unsigned readChunk_tEXt(LodePNGInfo* info, const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  char *key = 0, *str = 0;

  while(!error) /*not really a while loop, only used to break on error*/ {
    unsigned length, string2_begin;

    length = 0;
    while(length < chunkLength && data[length] != 0) ++length;
    /*even though it's not allowed by the standard, no error is thrown if
    there's no null termination char, if the text is empty*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(key, data, length);
    key[length] = 0;

    string2_begin = length + 1; /*skip keyword null terminator*/

    length = (unsigned)(chunkLength < string2_begin ? 0 : chunkLength - string2_begin);
    str = (char*)lodepng_malloc(length + 1);
    if(!str) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(str, data + string2_begin, length);
    str[length] = 0;

    error = lodepng_add_text(info, key, str);

    break;
  }

  lodepng_free(key);
  lodepng_free(str);

  return error;
}